

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

void tcu::opt::registerLegacyOptions(Parser *parser)

{
  OptInfo local_78;
  
  local_78.setDefault = (SetDefaultFunc)0x0;
  local_78.shortName = (char *)0x0;
  local_78.isFlag = false;
  local_78.longName = "deqp-egl-config-id";
  local_78.description = "Legacy name for --deqp-gl-config-id";
  local_78.defaultValue = "-1";
  local_78.parse = de::cmdline::parseType<int>;
  local_78.namedValues = (void *)0x0;
  local_78.namedValuesEnd = (void *)0x0;
  local_78.namedValueStride = 0x10;
  local_78.dispatchParse = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLConfigID>;
  de::cmdline::detail::Parser::addOption(parser,&local_78);
  local_78.setDefault = (SetDefaultFunc)0x0;
  local_78.shortName = (char *)0x0;
  local_78.isFlag = false;
  local_78.longName = "deqp-egl-config-name";
  local_78.description = "Legacy name for --deqp-gl-config-name";
  local_78.defaultValue = (char *)0x0;
  local_78.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_78.namedValues = (void *)0x0;
  local_78.namedValuesEnd = (void *)0x0;
  local_78.namedValueStride = 0x28;
  local_78.dispatchParse = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLConfigName>;
  de::cmdline::detail::Parser::addOption(parser,&local_78);
  return;
}

Assistant:

void registerLegacyOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;

	parser
		<< Option<GLConfigID>			(DE_NULL,	"deqp-egl-config-id",			"Legacy name for --deqp-gl-config-id",	"-1")
		<< Option<GLConfigName>			(DE_NULL,	"deqp-egl-config-name",			"Legacy name for --deqp-gl-config-name");
}